

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::upper_bound
          (iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  key_type *x;
  bool bVar1;
  pointer y;
  less<int> local_51;
  int local_50;
  iterator local_40;
  byte local_21;
  key_type *local_20;
  key_type *k_local;
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this_local;
  iterator *it;
  
  local_21 = 0;
  local_20 = k;
  k_local = (key_type *)this;
  this_local = (mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
               __return_storage_ptr__;
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::begin(__return_storage_ptr__,
          &this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
         );
  do {
    treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    ::end(&local_40,
          &this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
         );
    bVar1 = operator!=(__return_storage_ptr__,&local_40);
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::~treeIterator(&local_40);
    if (!bVar1) {
      local_50 = 2;
LAB_0011e8cb:
      if ((local_21 & 1) == 0) {
        treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ::~treeIterator(__return_storage_ptr__);
      }
      if (local_50 != 1) {
        treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        ::end(__return_storage_ptr__,
              &this->
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             );
      }
      return __return_storage_ptr__;
    }
    key_comp(this);
    x = local_20;
    y = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ::operator->(__return_storage_ptr__);
    bVar1 = less<int>::operator()(&local_51,x,&y->first);
    if (bVar1) {
      local_21 = 1;
      local_50 = 1;
      goto LAB_0011e8cb;
    }
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++(__return_storage_ptr__);
  } while( true );
}

Assistant:

iterator		upper_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, it->first)) return it;
		}
		return this->end();
	}